

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O1

void instantiate_children
               (ecs_world_t *world,ecs_entity_t base,ecs_table_t *table,ecs_data_t *data,int32_t row
               ,int32_t count,ecs_table_t *child_table)

{
  short sVar1;
  ecs_vector_t *peVar2;
  ecs_column_t *peVar3;
  ulong uVar4;
  ecs_entity_t eVar5;
  int32_t iVar6;
  uint uVar7;
  int iVar8;
  ecs_data_t *data_00;
  void *pvVar9;
  void *pvVar10;
  ecs_table_t *table_00;
  ecs_data_t *data_01;
  short offset;
  int iVar11;
  ecs_entity_t eVar12;
  long lVar13;
  int32_t *row_out;
  ulong uVar14;
  ecs_world_t *world_00;
  ulong uVar15;
  int iVar16;
  undefined8 uStack_a0;
  ecs_entity_t local_98;
  ecs_world_t *local_90;
  undefined1 local_88 [8];
  ecs_entities_t components;
  int32_t child_row;
  
  peVar2 = child_table->type;
  uStack_a0 = 0x1129ab;
  data_00 = ecs_table_get_data(child_table);
  if (data_00 != (ecs_data_t *)0x0) {
    uStack_a0 = 0x1129bf;
    iVar6 = ecs_table_data_count(data_00);
    if (iVar6 != 0) {
      iVar8 = child_table->column_count;
      uStack_a0 = 0x1129ec;
      local_90 = world;
      components._12_4_ = row;
      pvVar9 = _ecs_vector_first(peVar2,8,0x10);
      uStack_a0 = 0x1129f8;
      uVar7 = ecs_vector_count(peVar2);
      local_88 = (undefined1  [8])
                 ((long)&local_98 - ((long)(int)(uVar7 * 8 + 1) + 0xfU & 0xfffffffffffffff0));
      components.array._0_4_ = 0;
      eVar12 = (long)local_88 - ((long)iVar8 * 8 + 0xfU & 0xfffffffffffffff0);
      local_98 = eVar12;
      if ((int)uVar7 < 1) {
        iVar11 = -1;
        iVar16 = 0;
      }
      else {
        uVar14 = 0;
        iVar11 = -1;
        lVar13 = 10;
        iVar16 = 0;
        do {
          uVar15 = *(ulong *)((long)pvVar9 + uVar14 * 8);
          if (uVar15 != 0x101) {
            if ((uVar15 & 0xffffffffffffff) == base &&
                (uVar15 & 0xff00000000000000) == 0xfd00000000000000) {
              iVar11 = iVar16;
            }
            if ((long)uVar14 < (long)iVar8) {
              peVar3 = data_00->columns;
              offset = *(short *)((long)&peVar3->data + lVar13);
              if (offset < 0x11) {
                offset = 0x10;
              }
              peVar2 = *(ecs_vector_t **)((long)peVar3 + lVar13 + -10);
              sVar1 = *(short *)((long)peVar3 + lVar13 + -2);
              *(undefined8 *)(eVar12 - 8) = 0x112add;
              pvVar10 = _ecs_vector_first(peVar2,(int)sVar1,offset);
              *(void **)(local_98 + (long)iVar16 * 8) = pvVar10;
            }
            *(ulong *)((long)local_88 + (long)iVar16 * 8) = uVar15;
            iVar16 = iVar16 + 1;
          }
          uVar14 = uVar14 + 1;
          lVar13 = lVar13 + 0x10;
        } while (uVar7 != uVar14);
      }
      *(undefined8 *)(eVar12 - 8) = 0x112b5b;
      _ecs_assert(iVar11 != -1,0xc,(char *)0x0,"base_index != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x20c);
      world_00 = local_90;
      if (iVar11 == -1) {
        *(code **)(eVar12 - 8) = set_switch;
        __assert_fail("base_index != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                      ,0x20c,
                      "void instantiate_children(ecs_world_t *, ecs_entity_t, ecs_table_t *, ecs_data_t *, int32_t, int32_t, ecs_table_t *)"
                     );
      }
      if ((table->flags & 2) != 0) {
        *(ecs_entity_t *)((long)local_88 + (long)iVar16 * 8) = 0x101;
        iVar16 = iVar16 + 1;
      }
      peVar2 = data->entities;
      components.array._0_4_ = iVar16;
      *(undefined8 *)(eVar12 - 8) = 0x112ba5;
      pvVar9 = _ecs_vector_first(peVar2,8,0x10);
      peVar2 = data_00->entities;
      *(undefined8 *)(eVar12 - 8) = 0x112bb1;
      uVar7 = ecs_vector_count(peVar2);
      if (0 < count) {
        iVar8 = count + components._12_4_;
        lVar13 = (long)(int)components._12_4_;
        do {
          uVar14 = *(ulong *)((long)pvVar9 + lVar13 * 8);
          *(ulong *)((long)local_88 + (long)iVar11 * 8) = uVar14 | 0xfd00000000000000;
          *(undefined8 *)(eVar12 - 8) = 0x112c10;
          table_00 = ecs_table_find_or_create(world_00,(ecs_entities_t *)local_88);
          row_out = (int32_t *)0x222;
          *(undefined8 *)(eVar12 - 8) = 0x112c3c;
          _ecs_assert(table_00 != (ecs_table_t *)0x0,0xc,(char *)0x0,"i_table != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                      ,0x222);
          if (table_00 == (ecs_table_t *)0x0) {
            *(undefined8 *)(eVar12 - 8) = 0x112d71;
            __assert_fail("i_table != ((void*)0)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                          ,0x222,
                          "void instantiate_children(ecs_world_t *, ecs_entity_t, ecs_table_t *, ecs_data_t *, int32_t, int32_t, ecs_table_t *)"
                         );
          }
          peVar2 = data_00->entities;
          *(undefined8 *)(eVar12 - 8) = 0x112c5b;
          pvVar10 = _ecs_vector_first(peVar2,8,0x10);
          if (0 < (int)uVar7) {
            uVar15 = 0;
            do {
              uVar4 = *(ulong *)((long)pvVar10 + uVar15 * 8);
              row_out = (int32_t *)0x22d;
              *(undefined8 *)(eVar12 - 8) = 0x112c94;
              _ecs_assert(uVar4 != uVar14,2,(char *)0x0,"child != instance",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                          ,0x22d);
              if (uVar4 == uVar14) {
                *(undefined8 *)(eVar12 - 8) = 0x112d52;
                __assert_fail("child != instance",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                              ,0x22d,
                              "void instantiate_children(ecs_world_t *, ecs_entity_t, ecs_table_t *, ecs_data_t *, int32_t, int32_t, ecs_table_t *)"
                             );
              }
              uVar15 = uVar15 + 1;
            } while (uVar7 != uVar15);
          }
          world_00 = local_90;
          eVar5 = local_98;
          *(undefined8 *)(eVar12 - 8) = 0x112ccd;
          new_w_data(world_00,table_00,(ecs_entities_t *)(ulong)uVar7,(int32_t)eVar5,
                     (void **)&components.count,row_out);
          *(undefined8 *)(eVar12 - 8) = 0x112cd5;
          data_01 = ecs_table_get_data(table_00);
          if (0 < (int)uVar7) {
            uVar14 = 0;
            do {
              eVar5 = *(ecs_entity_t *)((long)pvVar10 + uVar14 * 8);
              iVar16 = components.count + (int)uVar14;
              *(undefined8 *)(eVar12 - 8) = 0x112cff;
              instantiate(world_00,eVar5,table_00,data_01,iVar16,1);
              uVar14 = uVar14 + 1;
            } while (uVar7 != uVar14);
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 < iVar8);
      }
    }
  }
  return;
}

Assistant:

static
void instantiate_children(
    ecs_world_t * world,
    ecs_entity_t base,
    ecs_table_t * table,
    ecs_data_t * data,
    int32_t row,
    int32_t count,
    ecs_table_t * child_table)
{
    ecs_type_t type = child_table->type;
    ecs_data_t *child_data = ecs_table_get_data(child_table);
    if (!child_data || !ecs_table_data_count(child_data)) {
        return;
    }

    int32_t column_count = child_table->column_count;
    ecs_entity_t *type_array = ecs_vector_first(type, ecs_entity_t);
    int32_t type_count = ecs_vector_count(type);   

    /* Instantiate child table for each instance */

    /* Create component array for creating the table */
    ecs_entities_t components = {
        .array = ecs_os_alloca(ECS_SIZEOF(ecs_entity_t) * type_count + 1)
    };

    void **c_info = ecs_os_alloca(ECS_SIZEOF(void*) * column_count);

    /* Copy in component identifiers. Find the base index in the component
     * array, since we'll need this to replace the base with the instance id */
    int i, base_index = -1, pos = 0;

    for (i = 0; i < type_count; i ++) {
        ecs_entity_t c = type_array[i];
        
        /* Make sure instances don't have EcsPrefab */
        if (c == EcsPrefab) {
            continue;
        }

        /* Keep track of the element that creates the CHILDOF relationship with
        * the prefab parent. We need to replace this element to make sure the
        * created children point to the instance and not the prefab */ 
        if (ECS_HAS_ROLE(c, CHILDOF) && (c & ECS_COMPONENT_MASK) == base) {
            base_index = pos;
        }        

        /* Store pointer to component array. We'll use this component array to
        * create our new entities in bulk with new_w_data */
        if (i < column_count) {
            ecs_column_t *column = &child_data->columns[i];
            c_info[pos] = ecs_vector_first_t(
                column->data, column->size, column->alignment);
        }

        components.array[pos] = c;
        pos ++;
    }

    ecs_assert(base_index != -1, ECS_INTERNAL_ERROR, NULL);

    /* If children are added to a prefab, make sure they are prefabs too */
    if (table->flags & EcsTableIsPrefab) {
        components.array[pos] = EcsPrefab;
        pos ++;
    }

    components.count = pos;

    /* Instantiate the prefab child table for each new instance */
    ecs_entity_t *entities = ecs_vector_first(data->entities, ecs_entity_t);
    int32_t child_count = ecs_vector_count(child_data->entities);

    for (i = row; i < count + row; i ++) {
        ecs_entity_t instance = entities[i];

        /* Replace CHILDOF element in the component array with instance id */
        components.array[base_index] = ECS_CHILDOF | instance;

        /* Find or create table */
        ecs_table_t *i_table = ecs_table_find_or_create(world, &components);
        ecs_assert(i_table != NULL, ECS_INTERNAL_ERROR, NULL); 

        /* The instance is trying to instantiate from a base that is also
         * its parent. This would cause the hierarchy to instantiate itself
         * which would cause infinite recursion. */
        int j;
        ecs_entity_t *children = ecs_vector_first(
            child_data->entities, ecs_entity_t);
#ifndef NDEBUG
        for (j = 0; j < child_count; j ++) {
            ecs_entity_t child = children[j];        
            ecs_assert(child != instance, ECS_INVALID_PARAMETER, NULL);
        }
#endif

        /* Create children */
        int32_t child_row; 
        new_w_data(world, i_table, NULL, child_count, c_info, &child_row);       

        /* If prefab child table has children itself, recursively instantiate */
        ecs_data_t *i_data = ecs_table_get_data(i_table);
        for (j = 0; j < child_count; j ++) {
            ecs_entity_t child = children[j];
            instantiate(world, child, i_table, i_data, child_row + j, 1);
        }
    }       
}